

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::ClearTable(UntypedMapBase *this,ClearInput input)

{
  uint uVar1;
  TableEntryPtr *pTVar2;
  TableEntryPtr TVar3;
  NodeBase *pNVar4;
  string *psVar5;
  NodeBase *pNVar6;
  TreeForMap *pTVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  map_index_t local_44;
  unsigned_long local_40 [2];
  
  uVar11 = input._0_8_;
  local_44 = this->num_buckets_;
  local_40[0] = 1;
  psVar5 = absl::lts_20240722::log_internal::Check_NEImpl<unsigned_int,unsigned_long>
                     (&local_44,local_40,"num_buckets_ != kGlobalEmptyTableSize");
  if (psVar5 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map.cc"
               ,0x74,psVar5->_M_string_length,(psVar5->_M_dataplus)._M_p);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_40)
    ;
  }
  if (((this->alloc_).arena_ == (Arena *)0x0) && (input.destroy_bits < 9)) {
    switch(uVar11 >> 0x20 & 0xff) {
    case 0:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 1:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          std::__cxx11::string::~string((string *)(pNVar6 + 1));
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 2:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          std::__cxx11::string::~string((string *)((long)&pNVar6->next + (uVar11 & 0xffff)));
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 3:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          std::__cxx11::string::~string((string *)(pNVar6 + 1));
          std::__cxx11::string::~string((string *)((long)&pNVar6->next + (uVar11 & 0xffff)));
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 4:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          MessageLite::DestroyInstance((MessageLite *)((long)&pNVar6->next + (uVar11 & 0xffff)));
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 5:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          std::__cxx11::string::~string((string *)(pNVar6 + 1));
          MessageLite::DestroyInstance((MessageLite *)((long)&pNVar6->next + (uVar11 & 0xffff)));
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    case 6:
    case 7:
      break;
    case 8:
      pTVar2 = this->table_;
      uVar1 = this->num_buckets_;
      for (uVar10 = (ulong)this->index_of_first_non_null_; uVar10 < uVar1; uVar10 = uVar10 + 1) {
        TVar3 = pTVar2[uVar10];
        if ((TVar3 & 1) == 0) {
          pNVar6 = TableEntryToNode(TVar3);
        }
        else {
          pTVar7 = TableEntryToTree(TVar3);
          pNVar6 = DestroyTree(this,pTVar7);
        }
        while (pNVar6 != (NodeBase *)0x0) {
          pNVar4 = pNVar6->next;
          (*input.destroy_node)(pNVar6);
          operator_delete(pNVar6,uVar11 >> 0x10 & 0xffff);
          pNVar6 = pNVar4;
        }
      }
      break;
    default:
      piVar8 = (int *)(*(code *)0x74736e6f)();
      *piVar8 = *piVar8 + 1;
      halt_baddata();
    }
  }
  pTVar2 = this->table_;
  uVar1 = this->num_buckets_;
  if ((uVar11 >> 0x28 & 1) == 0) {
    DeleteTable(this,pTVar2,uVar1);
  }
  else {
    for (lVar9 = 0; (ulong)uVar1 * 8 - lVar9 != 0; lVar9 = lVar9 + 8) {
      *(undefined8 *)((long)pTVar2 + lVar9) = 0;
    }
    this->num_elements_ = 0;
    this->index_of_first_non_null_ = uVar1;
  }
  return;
}

Assistant:

void UntypedMapBase::ClearTable(const ClearInput input) {
  ABSL_DCHECK_NE(num_buckets_, kGlobalEmptyTableSize);

  if (alloc_.arena() == nullptr) {
    const auto loop = [=](auto destroy_node) {
      const TableEntryPtr* table = table_;
      for (map_index_t b = index_of_first_non_null_, end = num_buckets_;
           b < end; ++b) {
        NodeBase* node =
            PROTOBUF_PREDICT_FALSE(internal::TableEntryIsTree(table[b]))
                ? DestroyTree(TableEntryToTree(table[b]))
                : TableEntryToNode(table[b]);

        while (node != nullptr) {
          NodeBase* next = node->next;
          destroy_node(node);
          SizedDelete(node, SizeFromInfo(input.size_info));
          node = next;
        }
      }
    };
    switch (input.destroy_bits) {
      case 0:
        loop([](NodeBase*) {});
        break;
      case kKeyIsString:
        loop([](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
        });
        break;
      case kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kKeyIsString | kValueIsString:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<std::string*>(node->GetVoidValue(size_info))
              ->~basic_string();
        });
        break;
      case kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kKeyIsString | kValueIsProto:
        loop([size_info = input.size_info](NodeBase* node) {
          static_cast<std::string*>(node->GetVoidKey())->~basic_string();
          static_cast<MessageLite*>(node->GetVoidValue(size_info))
              ->DestroyInstance();
        });
        break;
      case kUseDestructFunc:
        loop(input.destroy_node);
        break;
    }
  }

  if (input.reset_table) {
    std::fill(table_, table_ + num_buckets_, TableEntryPtr{});
    num_elements_ = 0;
    index_of_first_non_null_ = num_buckets_;
  } else {
    DeleteTable(table_, num_buckets_);
  }
}